

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_compute_forward_norm_f32(ggml_compute_params *params,ggml_tensor *src0,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  void *pvVar14;
  double dVar15;
  long lVar16;
  _Bool _Var17;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  int *in_RDI;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float scale;
  ggml_float v;
  int i00_1;
  ggml_float sum2;
  float *y;
  int i00;
  ggml_float mean;
  float *x;
  int i01;
  int i02;
  int i03;
  ggml_float eps;
  size_t nb3;
  size_t nb2;
  size_t nb1;
  size_t nb03;
  size_t nb02;
  size_t nb01;
  int ne03;
  int ne02;
  int ne01;
  int ne00;
  int nth;
  int ith;
  int local_a4;
  double local_a0;
  int local_8c;
  double local_88;
  int local_74;
  int local_70;
  int local_6c;
  
  _Var17 = ggml_are_same_shape(in_RSI,in_RDX);
  if (!_Var17) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x14f6,
            "ggml_are_same_shape(src0, dst)");
    abort();
  }
  if ((*in_RDI != 0) && (*in_RDI != 2)) {
    if (in_RSI->nb[0] != 4) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",
              0x14fc,"src0->nb[0] == sizeof(float)");
      abort();
    }
    iVar1 = in_RDI[1];
    iVar2 = in_RDI[2];
    iVar3 = in_RSI->ne[0];
    iVar4 = in_RSI->ne[1];
    iVar5 = in_RSI->ne[2];
    iVar6 = in_RSI->ne[3];
    sVar7 = in_RSI->nb[1];
    sVar8 = in_RSI->nb[2];
    sVar9 = in_RSI->nb[3];
    sVar10 = in_RDX->nb[1];
    sVar11 = in_RDX->nb[2];
    sVar12 = in_RDX->nb[3];
    for (local_6c = 0; local_6c < iVar6; local_6c = local_6c + 1) {
      for (local_70 = 0; local_74 = iVar1, local_70 < iVar5; local_70 = local_70 + 1) {
        for (; local_74 < iVar4; local_74 = iVar2 + local_74) {
          pvVar13 = in_RSI->data;
          lVar16 = (long)local_6c * sVar9 + (long)local_70 * sVar8 + (long)local_74 * sVar7;
          local_88 = 0.0;
          for (local_8c = 0; local_8c < iVar3; local_8c = local_8c + 1) {
            local_88 = (double)*(float *)((long)pvVar13 + (long)local_8c * 4 + lVar16) + local_88;
          }
          pvVar14 = in_RDX->data;
          local_a0 = 0.0;
          for (local_a4 = 0; local_a4 < iVar3; local_a4 = local_a4 + 1) {
            dVar15 = (double)*(float *)((long)pvVar13 + (long)local_a4 * 4 + lVar16) -
                     local_88 / (double)iVar3;
            *(float *)((long)pvVar14 +
                      (long)local_a4 * 4 +
                      (long)local_6c * sVar12 + (long)local_70 * sVar11 + (long)local_74 * sVar10) =
                 (float)dVar15;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = dVar15;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = dVar15;
            auVar20._8_8_ = 0;
            auVar20._0_8_ = local_a0;
            auVar18 = vfmadd213sd_fma(auVar18,auVar19,auVar20);
            local_a0 = auVar18._0_8_;
          }
          sqrt(local_a0 / (double)iVar3 + 9.999999747378752e-06);
          ggml_vec_scale_f32(i00,y,sum2._4_4_);
        }
      }
    }
  }
  return;
}

Assistant:

static void ggml_compute_forward_norm_f32(
        const struct ggml_compute_params * params,
        const struct ggml_tensor * src0,
        struct ggml_tensor * dst) {
    GGML_ASSERT(ggml_are_same_shape(src0, dst));

    if (params->type == GGML_TASK_INIT || params->type == GGML_TASK_FINALIZE) {
        return;
    }

    GGML_ASSERT(src0->nb[0] == sizeof(float));

    const int ith = params->ith;
    const int nth = params->nth;

    const int ne00 = src0->ne[0];
    const int ne01 = src0->ne[1];
    const int ne02 = src0->ne[2];
    const int ne03 = src0->ne[3];

    const size_t nb01 = src0->nb[1];
    const size_t nb02 = src0->nb[2];
    const size_t nb03 = src0->nb[3];

    const size_t nb1 = dst->nb[1];
    const size_t nb2 = dst->nb[2];
    const size_t nb3 = dst->nb[3];

    const ggml_float eps = 1e-5f; // TODO: make this a parameter

    // TODO: optimize
    for (int i03 = 0; i03 < ne03; i03++) {
        for (int i02 = 0; i02 < ne02; i02++) {
            for (int i01 = ith; i01 < ne01; i01 += nth) {
                const float * x = (float *) ((char *) src0->data + i01*nb01 + i02*nb02 + i03*nb03);

                ggml_float mean = 0.0;
                for (int i00 = 0; i00 < ne00; i00++) {
                    mean += x[i00];
                }

                mean /= ne00;

                float * y = (float *) ((char *) dst->data + i01*nb1 + i02*nb2 + i03*nb3);

                ggml_float sum2 = 0.0;
                for (int i00 = 0; i00 < ne00; i00++) {
                    ggml_float v = x[i00] - mean;
                    y[i00] = v;
                    sum2 += v*v;
                }

                const float scale = 1.0/sqrt(sum2/ne00 + eps);

                ggml_vec_scale_f32(ne00, y, scale);
            }
        }
    }
}